

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O2

nvar_extended_attributes_t * __thiscall
ami_nvar_t::nvar_entry_body_t::extended_header_attributes(nvar_entry_body_t *this)

{
  nvar_attributes_t *pnVar1;
  kstream *this_00;
  nvar_extended_attributes_t *pnVar2;
  uint16_t uVar3;
  uint64_t pos;
  uint64_t uVar4;
  nvar_extended_attributes_t *this_01;
  
  if (this->f_extended_header_attributes == false) {
    this->n_extended_header_attributes = true;
    pnVar1 = (this->m__parent->m_attributes)._M_t.
             super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl;
    if ((pnVar1->m_valid == true) && (pnVar1->m_extended_header == true)) {
      uVar3 = extended_header_size(this);
      if (2 < uVar3) {
        this->n_extended_header_attributes = false;
        pos = kaitai::kstream::pos((this->super_kstruct).m__io);
        this_00 = (this->super_kstruct).m__io;
        uVar4 = kaitai::kstream::pos(this_00);
        uVar3 = extended_header_size(this);
        kaitai::kstream::seek(this_00,uVar4 - uVar3);
        this_01 = (nvar_extended_attributes_t *)operator_new(0x40);
        nvar_extended_attributes_t::nvar_extended_attributes_t
                  (this_01,(this->super_kstruct).m__io,this,this->m__root);
        pnVar2 = (this->m_extended_header_attributes)._M_t.
                 super___uniq_ptr_impl<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
                 .super__Head_base<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_false>.
                 _M_head_impl;
        (this->m_extended_header_attributes)._M_t.
        super___uniq_ptr_impl<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
        ._M_t.
        super__Tuple_impl<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
        .super__Head_base<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_false>._M_head_impl =
             this_01;
        if (pnVar2 != (nvar_extended_attributes_t *)0x0) {
          (**(code **)((long)(pnVar2->super_kstruct)._vptr_kstruct + 8))();
        }
        kaitai::kstream::seek((this->super_kstruct).m__io,pos);
        this->f_extended_header_attributes = true;
      }
    }
  }
  return (this->m_extended_header_attributes)._M_t.
         super___uniq_ptr_impl<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
         ._M_t.
         super__Tuple_impl<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
         .super__Head_base<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_false>._M_head_impl;
}

Assistant:

ami_nvar_t::nvar_extended_attributes_t* ami_nvar_t::nvar_entry_body_t::extended_header_attributes() {
    if (f_extended_header_attributes)
        return m_extended_header_attributes.get();
    n_extended_header_attributes = true;
    if ( ((_parent()->attributes()->valid()) && (_parent()->attributes()->extended_header()) && (extended_header_size() >= (1 + 2))) ) {
        n_extended_header_attributes = false;
        std::streampos _pos = m__io->pos();
        m__io->seek((_io()->pos() - extended_header_size()));
        m_extended_header_attributes = std::unique_ptr<nvar_extended_attributes_t>(new nvar_extended_attributes_t(m__io, this, m__root));
        m__io->seek(_pos);
        f_extended_header_attributes = true;
    }
    return m_extended_header_attributes.get();
}